

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O1

void __thiscall webfront::uri::URI::URI(URI *this,string_view uri)

{
  char *in_RCX;
  string_view uri_00;
  string_view uri_01;
  string_view uri_02;
  string_view uri_03;
  string_view uri_04;
  string_view sVar1;
  
  uri_04._M_len = uri._M_str;
  uri_04._M_str = in_RCX;
  decode_abi_cxx11_((string *)this,(uri *)uri._M_len,uri_04);
  sVar1._M_str = (this->string)._M_dataplus._M_p;
  sVar1._M_len = (this->string)._M_string_length;
  sVar1 = next(this,sVar1);
  this->scheme = sVar1;
  uri_00._M_str = (this->string)._M_dataplus._M_p;
  uri_00._M_len = (this->string)._M_string_length;
  sVar1 = next(this,uri_00);
  this->authority = sVar1;
  uri_01._M_str = (this->string)._M_dataplus._M_p;
  uri_01._M_len = (this->string)._M_string_length;
  sVar1 = next(this,uri_01);
  this->path = sVar1;
  uri_02._M_str = (this->string)._M_dataplus._M_p;
  uri_02._M_len = (this->string)._M_string_length;
  sVar1 = next(this,uri_02);
  this->query = sVar1;
  uri_03._M_str = (this->string)._M_dataplus._M_p;
  uri_03._M_len = (this->string)._M_string_length;
  sVar1 = next(this,uri_03);
  this->fragment = sVar1;
  sVar1 = next(this,this->authority);
  this->userinfo = sVar1;
  sVar1 = next(this,this->authority);
  this->host = sVar1;
  sVar1 = next(this,this->authority);
  this->port = sVar1;
  return;
}

Assistant:

URI(std::string_view uri) : string(decode(uri)), scheme(next(string)), authority(next(string)), path(next(string)), query(next(string)),
        fragment(next(string)), userinfo(next(authority)), host(next(authority)), port(next(authority)) {}